

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O2

bool EntityRelationTask::check_constraints(size_t ent1_id,size_t ent2_id,size_t rel_id)

{
  bool bVar1;
  size_t valid_ent2_id [5];
  size_t valid_ent1_id [5];
  
  valid_ent2_id[0] = 4;
  valid_ent2_id[1] = 4;
  valid_ent2_id[2] = 4;
  valid_ent2_id[3] = 3;
  valid_ent2_id[4] = 2;
  bVar1 = true;
  if ((rel_id != 10) &&
     ((valid_ent2_id[rel_id + 1] != ent1_id || (valid_ent2_id[rel_id - 5] != ent2_id)))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool check_constraints(size_t ent1_id, size_t ent2_id, size_t rel_id)
{
  size_t valid_ent1_id[] = {2, 3, 4, 2, 2};  // encode the valid entity-relation combinations
  size_t valid_ent2_id[] = {4, 4, 4, 3, 2};
  if (rel_id - 5 == 5)
    return true;
  if (valid_ent1_id[rel_id - 5] == ent1_id && valid_ent2_id[rel_id - 5] == ent2_id)
    return true;
  return false;
}